

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_3e4217::ArgParser::argVersion(ArgParser *this)

{
  Pipeline *pPVar1;
  Pipeline *this_00;
  string *str;
  string whoami;
  bool local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  QPDFLogger local_38;
  string local_28;
  
  QPDFArgParser::getProgname_abi_cxx11_(&local_28,&this->ap);
  QPDFLogger::defaultLogger();
  QPDFLogger::getInfo(&local_38,local_48);
  pPVar1 = Pipeline::operator<<
                     ((Pipeline *)
                      local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&local_28);
  this_00 = Pipeline::operator<<(pPVar1," version ");
  str = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)pPVar1);
  pPVar1 = Pipeline::operator<<(this_00,str);
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"Run ");
  pPVar1 = Pipeline::operator<<(pPVar1,&local_28);
  Pipeline::operator<<(pPVar1," --copyright to see copyright and license information.\n");
  if (local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ArgParser::argVersion()
{
    auto whoami = this->ap.getProgname();
    *QPDFLogger::defaultLogger()->getInfo()
        << whoami << " version " << QPDF::QPDFVersion() << "\n"
        << "Run " << whoami << " --copyright to see copyright and license information.\n";
}